

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O2

bool Diligent::ShaderSerializer<(Diligent::SerializerMode)2>::SerializeBytecodeOrSource
               (Serializer<(Diligent::SerializerMode)2> *Ser,ConstQual<ShaderCreateInfo> *CI)

{
  TEnable<unsigned_char> TVar1;
  bool bVar2;
  void *pvVar3;
  Uint8 UseBytecode;
  undefined7 uStack_37;
  
  pvVar3 = CI->ByteCode;
  if (pvVar3 != (void *)0x0 && CI->Source != (Char *)0x0) {
    FormatString<char[47]>
              ((string *)&UseBytecode,
               (char (*) [47])"Only one of Source or Bytecode can be non-null");
    DebugAssertionFailed
              ((Char *)CONCAT71(uStack_37,UseBytecode),"SerializeBytecodeOrSource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PSOSerializer.cpp"
               ,0x1ca);
    std::__cxx11::string::~string((string *)&UseBytecode);
    pvVar3 = CI->ByteCode;
  }
  UseBytecode = pvVar3 != (void *)0x0;
  TVar1 = Serializer<(Diligent::SerializerMode)2>::Serialize<unsigned_char>(Ser,&UseBytecode);
  if (TVar1) {
    bVar2 = Serializer<(Diligent::SerializerMode)2>::SerializeBytes
                      (Ser,(&CI->Source)[UseBytecode != '\0'],&(CI->field_4).SourceLength,8);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ShaderSerializer<Mode>::SerializeBytecodeOrSource(Serializer<Mode>&            Ser,
                                                       ConstQual<ShaderCreateInfo>& CI)
{
    VERIFY(CI.Source == nullptr || CI.ByteCode == nullptr, "Only one of Source or Bytecode can be non-null");
    const Uint8 UseBytecode = CI.ByteCode != nullptr ? 1 : 0;

    if (!Ser(UseBytecode))
        return false;

    if (UseBytecode)
        return Ser.SerializeBytes(CI.ByteCode, CI.ByteCodeSize);
    else
        return Ser.SerializeBytes(CI.Source, CI.SourceLength);
}